

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

void uv__udp_sendmsg(uv_udp_t *handle)

{
  int iVar1;
  undefined8 *puVar2;
  long lVar3;
  int *piVar4;
  long *plVar5;
  msghdr h;
  msghdr local_68;
  
  plVar5 = (long *)handle->write_queue[0];
  if (handle->write_queue != (void **)plVar5) {
    do {
      if (plVar5 == (long *)0x0) {
        __assert_fail("q != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/udp.c"
                      ,0xe0,"void uv__udp_sendmsg(uv_udp_t *)");
      }
      local_68.msg_control = (void *)0x0;
      local_68.msg_controllen = 0;
      local_68.msg_flags = 0;
      local_68._52_4_ = 0;
      local_68.msg_name = plVar5 + 2;
      local_68.msg_namelen = 0x10;
      if ((short)plVar5[2] == 10) {
        local_68.msg_namelen = 0x1c;
      }
      local_68._12_4_ = 0;
      local_68.msg_iov = (iovec *)plVar5[0x13];
      local_68.msg_iovlen = (size_t)*(uint *)(plVar5 + 0x12);
      do {
        lVar3 = sendmsg((handle->io_watcher).fd,&local_68,0);
        if (lVar3 != -1) goto LAB_0015c157;
        piVar4 = __errno_location();
        iVar1 = *piVar4;
      } while ((long)iVar1 == 4);
      if (iVar1 == 0xb) {
        return;
      }
      lVar3 = -(long)iVar1;
LAB_0015c157:
      plVar5[0x14] = lVar3;
      *(long *)plVar5[1] = *plVar5;
      *(long *)(*plVar5 + 8) = plVar5[1];
      *plVar5 = (long)handle->write_completed_queue;
      puVar2 = (undefined8 *)handle->write_completed_queue[1];
      plVar5[1] = (long)puVar2;
      *puVar2 = plVar5;
      handle->write_completed_queue[1] = plVar5;
      uv__io_feed(handle->loop,&handle->io_watcher);
      plVar5 = (long *)handle->write_queue[0];
    } while (handle->write_queue != (void **)plVar5);
  }
  return;
}

Assistant:

static void uv__udp_sendmsg(uv_udp_t* handle) {
  uv_udp_send_t* req;
  QUEUE* q;
  struct msghdr h;
  ssize_t size;

  while (!QUEUE_EMPTY(&handle->write_queue)) {
    q = QUEUE_HEAD(&handle->write_queue);
    assert(q != NULL);

    req = QUEUE_DATA(q, uv_udp_send_t, queue);
    assert(req != NULL);

    memset(&h, 0, sizeof h);
    if (req->addr.ss_family == AF_UNSPEC) {
      h.msg_name = NULL;
      h.msg_namelen = 0;
    } else {
      h.msg_name = &req->addr;
      if (req->addr.ss_family == AF_INET6)
        h.msg_namelen = sizeof(struct sockaddr_in6);
      else if (req->addr.ss_family == AF_INET)
        h.msg_namelen = sizeof(struct sockaddr_in);
      else if (req->addr.ss_family == AF_UNIX)
        h.msg_namelen = sizeof(struct sockaddr_un);
      else {
        assert(0 && "unsupported address family");
        abort();
      }
    }
    h.msg_iov = (struct iovec*) req->bufs;
    h.msg_iovlen = req->nbufs;

    do {
      size = sendmsg(handle->io_watcher.fd, &h, 0);
    } while (size == -1 && errno == EINTR);

    if (size == -1) {
      if (errno == EAGAIN || errno == EWOULDBLOCK || errno == ENOBUFS)
        break;
    }

    req->status = (size == -1 ? UV__ERR(errno) : size);

    /* Sending a datagram is an atomic operation: either all data
     * is written or nothing is (and EMSGSIZE is raised). That is
     * why we don't handle partial writes. Just pop the request
     * off the write queue and onto the completed queue, done.
     */
    QUEUE_REMOVE(&req->queue);
    QUEUE_INSERT_TAIL(&handle->write_completed_queue, &req->queue);
    uv__io_feed(handle->loop, &handle->io_watcher);
  }
}